

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.h
# Opt level: O3

void __thiscall xemmai::t_engine::f_wait(t_engine *this)

{
  t_engine tVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  
  LOCK();
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  UNLOCK();
  LOCK();
  tVar1 = *this;
  *this = (t_engine)0x1;
  UNLOCK();
  if (tVar1 == (t_engine)0x0) {
    uVar3 = (ulong)(((uint)this & 0x38) << 5);
    LOCK();
    *(int *)(std::__detail::__waiter_pool_base::_S_for(void_const*)::__w + uVar3 + 0x40) =
         *(int *)(std::__detail::__waiter_pool_base::_S_for(void_const*)::__w + uVar3 + 0x40) + 1;
    UNLOCK();
    if (*(int *)(std::__detail::__waiter_pool_base::_S_for(void_const*)::__w + uVar3) != 0) {
      syscall(0xca,uVar3 + 0x11f840,1,0x7fffffff);
    }
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this;
  std::
  __atomic_wait_address_v<bool,std::atomic_flag::wait(bool,std::memory_order)const::_lambda()_1_>
            ((bool *)this,true,(anon_class_16_2_20c11228_for___vfn)(auVar2 << 0x40));
  return;
}

Assistant:

void f_wait()
	{
		v_collector__wait.fetch_add(1, std::memory_order_relaxed);
		if (!v_collector__running.test_and_set(std::memory_order_release)) v_collector__running.notify_one();
		v_collector__running.wait(true, std::memory_order_relaxed);
	}